

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::CalcWindowNextAutoFitSize(ImGuiWindow *window)

{
  undefined1 auVar1 [16];
  ImVec2 IVar2;
  undefined8 extraout_XMM0_Qb;
  ImVec2 size_auto_fit;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  
  local_20.x = 0.0;
  local_20.y = 0.0;
  CalcWindowContentSizes(window,&local_18,&local_20);
  IVar2 = CalcWindowAutoFitSize(window,&local_20);
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar1._0_4_ = IVar2.x;
  auVar1._4_4_ = IVar2.y;
  local_28 = (ImVec2)vmovlps_avx(auVar1);
  IVar2 = CalcWindowSizeAfterConstraint(window,&local_28);
  return IVar2;
}

Assistant:

ImVec2 ImGui::CalcWindowNextAutoFitSize(ImGuiWindow* window)
{
    ImVec2 size_contents_current;
    ImVec2 size_contents_ideal;
    CalcWindowContentSizes(window, &size_contents_current, &size_contents_ideal);
    ImVec2 size_auto_fit = CalcWindowAutoFitSize(window, size_contents_ideal);
    ImVec2 size_final = CalcWindowSizeAfterConstraint(window, size_auto_fit);
    return size_final;
}